

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath __thiscall testing::internal::FilePath::RemoveTrailingPathSeparator(FilePath *this)

{
  bool bVar1;
  char *buffer;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  String *in_RSI;
  FilePath FVar3;
  String *this_00;
  String local_28;
  FilePath *this_local;
  
  this_local = this;
  bVar1 = IsDirectory((FilePath *)in_RSI);
  if (bVar1) {
    buffer = String::c_str(in_RSI);
    sVar2 = String::length(in_RSI);
    this_00 = &local_28;
    String::String(this_00,buffer,sVar2 - 1);
    FilePath(this,this_00);
    String::~String(this_00);
    sVar2 = extraout_RDX_00;
  }
  else {
    FilePath(this,(FilePath *)in_RSI);
    sVar2 = extraout_RDX;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory()
      ? FilePath(String(pathname_.c_str(), pathname_.length() - 1))
      : *this;
}